

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O2

corpus_t *
corpus_load_headid(char *file,_func_int32_char_ptr *validate,
                  _func_int32_char_ptr_char_ptr *dup_resolve)

{
  int iVar1;
  int32 iVar2;
  FILE *__stream;
  char *pcVar3;
  hash_table_t *phVar4;
  char **ppcVar5;
  size_t sVar6;
  void *pvVar7;
  long ln;
  uint uVar8;
  corpus_t *pcVar9;
  int32 k;
  uint local_506c;
  char *local_5068;
  char *local_5060;
  void *local_5058;
  long local_5050;
  corpus_t *local_5048;
  _func_int32_char_ptr_char_ptr *local_5040;
  char wd [4096];
  char line [16384];
  
  local_5040 = dup_resolve;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
          ,0x9f,"Loading corpus (%s)\n",file);
  local_5068 = file;
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                   ,0xa2,"fopen(%s,r) failed\n",local_5068);
LAB_00109029:
    exit(1);
  }
  local_5048 = (corpus_t *)
               __ckd_calloc__(1,0x18,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                              ,0xa4);
  uVar8 = 0;
  while( true ) {
    pcVar3 = fgets(line,0x4000,__stream);
    if (pcVar3 == (char *)0x0) break;
    iVar1 = __isoc99_sscanf(line,"%s",wd);
    uVar8 = uVar8 + (iVar1 == 1);
  }
  rewind(__stream);
  phVar4 = hash_table_new(uVar8,0);
  pcVar9 = local_5048;
  local_5048->ht = phVar4;
  local_5048->n = 0;
  ppcVar5 = (char **)__ckd_calloc__((ulong)uVar8,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                                    ,0xb0);
  pcVar9->str = ppcVar5;
  local_506c = 0;
  do {
    local_5058 = (void *)(ulong)local_506c;
LAB_00108de3:
    do {
      pcVar3 = fgets(line,0x4000,__stream);
      uVar8 = local_506c;
      if (pcVar3 == (char *)0x0) {
        pcVar9->n = local_506c;
        fclose(__stream);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                ,0xe5,"%s: %d entries\n",local_5068,(ulong)uVar8);
        return pcVar9;
      }
      iVar1 = __isoc99_sscanf(line,"%s%n",wd,&k);
    } while (iVar1 != 1);
    sVar6 = strlen(line);
    if ((0 < (int)sVar6) && (uVar8 = (int)sVar6 - 1, line[uVar8] == '\n')) {
      line[uVar8] = '\0';
    }
    if (validate != (_func_int32_char_ptr *)0x0) {
      iVar2 = (*validate)(line + k);
      if (iVar2 == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                ,0xbf,"Corpus validation %s failed; skipping\n",wd);
        goto LAB_00108de3;
      }
    }
    local_5060 = __ckd_salloc__(wd,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                                ,0xc3);
    pvVar7 = hash_table_enter(pcVar9->ht,local_5060,local_5058);
    if (local_506c != (uint)pvVar7) {
      if (local_5040 == (_func_int32_char_ptr_char_ptr *)0x0) {
        ln = 0xc9;
LAB_00109018:
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                ,ln,"corpus_load_headid(%s) failed; duplicate ID: %s\n",local_5068,local_5060);
        goto LAB_00109029;
      }
      local_5050 = (long)(int)(uint)pvVar7;
      iVar2 = (*local_5040)(pcVar9->str[local_5050],line + k);
      if (iVar2 < 0) {
        ln = 0xcf;
        goto LAB_00109018;
      }
      ckd_free(local_5060);
      pcVar9 = local_5048;
      if (iVar2 != 0) {
        ckd_free(local_5048->str[local_5050]);
        pcVar3 = __ckd_salloc__(line + k,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                                ,0xd4);
        pcVar9->str[local_5050] = pcVar3;
      }
      goto LAB_00108de3;
    }
    pcVar3 = __ckd_salloc__(line + k,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                            ,0xdd);
    pcVar9->str[(long)local_5058] = pcVar3;
    local_506c = local_506c + 1;
  } while( true );
}

Assistant:

corpus_t *
corpus_load_headid(const char *file,
                   int32(*validate) (char *str),
                   int32(*dup_resolve) (char *s1, char *s2))
{
    FILE *fp;
    char line[16384], wd[4096], *id;
    int32 j, k, m, n;
    corpus_t *corp;

    E_INFO("Loading corpus (%s)\n", file);

    if ((fp = fopen(file, "r")) == NULL)
        E_FATAL_SYSTEM("fopen(%s,r) failed\n", file);

    corp = (corpus_t *) ckd_calloc(1, sizeof(corpus_t));

    n = 0;
    while (fgets(line, sizeof(line), fp) != NULL) {
        /* Skip empty lines */
        if (sscanf(line, "%s", wd) == 1)
            n++;
    }
    rewind(fp);

    corp->ht = hash_table_new(n, HASH_CASE_YES);
    corp->n = 0;
    corp->str = (char **) ckd_calloc(n, sizeof(char *));

    n = 0;
    while (fgets(line, sizeof(line), fp) != NULL) {
        /* Skip blank lines */
        if (sscanf(line, "%s%n", wd, &k) != 1)
            continue;

        /* Eliminate the line-terminating newline */
        j = strlen(line);
        if ((j > 0) && (line[j - 1] == '\n'))
            line[j - 1] = '\0';

        /* Validate if a validation function is given */
        if (validate && (!(*validate) (line + k))) {
            E_INFO("Corpus validation %s failed; skipping\n", wd);
            continue;
        }

        id = ckd_salloc(wd);
        if ((m = (long) hash_table_enter(corp->ht, id, (void *)(long)n)) != n) {
            /* Duplicate entry */
            if (!dup_resolve)
                E_FATAL
                    ("corpus_load_headid(%s) failed; duplicate ID: %s\n",
                     file, id);
            else {
                /* Invoke the application provided duplicate resolver function */
                if ((j = (*dup_resolve) (corp->str[m], line + k)) < 0)
                    E_FATAL
                        ("corpus_load_headid(%s) failed; duplicate ID: %s\n",
                         file, id);
                ckd_free(id);
                if (j > 0) {
                    /* Overwrite the original with the new entry */
                    ckd_free(corp->str[m]);
                    corp->str[m] = ckd_salloc(line + k);
                }
                else {
                    /* Retain the original entry, discard the new one */
                }
            }
        }
        else {
            /* Fill in new entry */
            corp->str[n] = ckd_salloc(line + k);
            n++;
        }
    }
    corp->n = n;

    fclose(fp);

    E_INFO("%s: %d entries\n", file, n);

    return corp;
}